

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.inc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::cpp_unittest::OneofTest_MergeFrom_Test::TestBody
          (OneofTest_MergeFrom_Test *this)

{
  TestOneof2 *pTVar1;
  bool bVar2;
  FooCase FVar3;
  char *pcVar4;
  Arena *pAVar5;
  string *psVar6;
  TestOneof2_NestedMessage *pTVar7;
  TestOneof2_FooGroup *pTVar8;
  char *in_R9;
  AssertHelper local_368;
  Message local_360;
  int local_358;
  int32_t local_354;
  undefined1 local_350 [8];
  AssertionResult gtest_ar_5;
  AssertHelper local_320;
  Message local_318;
  bool local_309;
  undefined1 local_308 [8];
  AssertionResult gtest_ar__5;
  Message local_2f0;
  int local_2e4;
  int64_t local_2e0;
  undefined1 local_2d8 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_2a8;
  Message local_2a0;
  bool local_291;
  undefined1 local_290 [8];
  AssertionResult gtest_ar__4;
  Message local_278;
  TestOneof2_NestedEnum local_26c;
  undefined1 local_268 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_238;
  Message local_230;
  bool local_221;
  undefined1 local_220 [8];
  AssertionResult gtest_ar__3;
  Message local_208;
  undefined1 local_200 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_1d0;
  Message local_1c8;
  bool local_1b9;
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar__2;
  Message local_1a0;
  undefined1 local_198 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_168;
  Message local_160;
  bool local_151;
  undefined1 local_150 [8];
  AssertionResult gtest_ar__1;
  Message local_138;
  int local_130;
  int32_t local_12c;
  undefined1 local_128 [8];
  AssertionResult gtest_ar;
  AssertHelper local_f8;
  Message local_f0;
  bool local_e1;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar_;
  undefined1 local_c0 [8];
  TestOneof2 message2;
  TestOneof2 message1;
  OneofTest_MergeFrom_Test *this_local;
  
  message1.field_0._impl_._oneof_case_ = (uint32_t  [2])this;
  proto2_unittest::TestOneof2::TestOneof2((TestOneof2 *)((long)&message2.field_0 + 0x28));
  proto2_unittest::TestOneof2::TestOneof2((TestOneof2 *)local_c0);
  proto2_unittest::TestOneof2::set_foo_int((TestOneof2 *)((long)&message2.field_0 + 0x28),0x7b);
  proto2_unittest::TestOneof2::MergeFrom
            ((TestOneof2 *)local_c0,(TestOneof2 *)((long)&message2.field_0 + 0x28));
  TestUtil::ExpectAtMostOneFieldSetInOneof<proto2_unittest::TestOneof2>((TestOneof2 *)local_c0);
  local_e1 = proto2_unittest::TestOneof2::has_foo_int((TestOneof2 *)local_c0);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_e0,&local_e1,(type *)0x0)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
  if (!bVar2) {
    testing::Message::Message(&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_e0,
               (AssertionResult *)"message2.has_foo_int()","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x7f5,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f8,&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  local_12c = proto2_unittest::TestOneof2::foo_int((TestOneof2 *)local_c0);
  local_130 = 0x7b;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_128,"message2.foo_int()","123",&local_12c,&local_130);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar2) {
    testing::Message::Message(&local_138);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x7f6,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  pTVar1 = (TestOneof2 *)((long)&message2.field_0 + 0x28);
  FVar3 = proto2_unittest::TestOneof2::foo_case(pTVar1);
  if (FVar3 != kFooString) {
    proto2_unittest::TestOneof2::clear_foo(pTVar1);
    proto2_unittest::TestOneof2::set_has_foo_string(pTVar1);
    protobuf::internal::ArenaStringPtr::InitDefault
              ((ArenaStringPtr *)((long)&message1.field_0 + 0x10));
  }
  pAVar5 = protobuf::MessageLite::GetArena((MessageLite *)pTVar1);
  protobuf::internal::ArenaStringPtr::Set
            ((ArenaStringPtr *)((long)&message1.field_0 + 0x10),"foo",pAVar5);
  proto2_unittest::TestOneof2::MergeFrom
            ((TestOneof2 *)local_c0,(TestOneof2 *)((long)&message2.field_0 + 0x28));
  TestUtil::ExpectAtMostOneFieldSetInOneof<proto2_unittest::TestOneof2>((TestOneof2 *)local_c0);
  local_151 = proto2_unittest::TestOneof2::has_foo_string((TestOneof2 *)local_c0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_150,&local_151,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
  if (!bVar2) {
    testing::Message::Message(&local_160);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_150,
               (AssertionResult *)"message2.has_foo_string()","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x7fb,pcVar4);
    testing::internal::AssertHelper::operator=(&local_168,&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_160);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
  psVar6 = proto2_unittest::TestOneof2::foo_string_abi_cxx11_((TestOneof2 *)local_c0);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[4],_nullptr>
            ((EqHelper *)local_198,"message2.foo_string()","\"foo\"",psVar6,(char (*) [4])0x1d63234)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
  if (!bVar2) {
    testing::Message::Message(&local_1a0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_198);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x7fc,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2.message_,&local_1a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_1a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
  pTVar1 = (TestOneof2 *)((long)&message2.field_0 + 0x28);
  FVar3 = proto2_unittest::TestOneof2::foo_case(pTVar1);
  if (FVar3 != kFooBytes) {
    proto2_unittest::TestOneof2::clear_foo(pTVar1);
    proto2_unittest::TestOneof2::set_has_foo_bytes(pTVar1);
    protobuf::internal::ArenaStringPtr::InitDefault
              ((ArenaStringPtr *)((long)&message1.field_0 + 0x10));
  }
  pAVar5 = protobuf::MessageLite::GetArena((MessageLite *)pTVar1);
  protobuf::internal::ArenaStringPtr::SetBytes
            ((ArenaStringPtr *)((long)&message1.field_0 + 0x10),"moo",pAVar5);
  proto2_unittest::TestOneof2::MergeFrom
            ((TestOneof2 *)local_c0,(TestOneof2 *)((long)&message2.field_0 + 0x28));
  TestUtil::ExpectAtMostOneFieldSetInOneof<proto2_unittest::TestOneof2>((TestOneof2 *)local_c0);
  local_1b9 = proto2_unittest::TestOneof2::has_foo_bytes((TestOneof2 *)local_c0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1b8,&local_1b9,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
  if (!bVar2) {
    testing::Message::Message(&local_1c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_2.message_,(internal *)local_1b8,
               (AssertionResult *)"message2.has_foo_bytes()","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x802,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1d0,&local_1c8);
    testing::internal::AssertHelper::~AssertHelper(&local_1d0);
    std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_1c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
  psVar6 = proto2_unittest::TestOneof2::foo_bytes_abi_cxx11_((TestOneof2 *)local_c0);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[4],_nullptr>
            ((EqHelper *)local_200,"message2.foo_bytes()","\"moo\"",psVar6,(char (*) [4])0x1cef5a1);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_200);
  if (!bVar2) {
    testing::Message::Message(&local_208);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_200);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x803,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3.message_,&local_208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_208);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_200);
  proto2_unittest::TestOneof2::set_foo_enum
            ((TestOneof2 *)((long)&message2.field_0 + 0x28),TestOneof2_NestedEnum_FOO);
  proto2_unittest::TestOneof2::MergeFrom
            ((TestOneof2 *)local_c0,(TestOneof2 *)((long)&message2.field_0 + 0x28));
  TestUtil::ExpectAtMostOneFieldSetInOneof<proto2_unittest::TestOneof2>((TestOneof2 *)local_c0);
  local_221 = proto2_unittest::TestOneof2::has_foo_enum((TestOneof2 *)local_c0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_220,&local_221,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
  if (!bVar2) {
    testing::Message::Message(&local_230);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_3.message_,(internal *)local_220,
               (AssertionResult *)"message2.has_foo_enum()","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x808,pcVar4);
    testing::internal::AssertHelper::operator=(&local_238,&local_230);
    testing::internal::AssertHelper::~AssertHelper(&local_238);
    std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_230);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
  local_26c = proto2_unittest::TestOneof2::foo_enum((TestOneof2 *)local_c0);
  testing::internal::EqHelper::
  Compare<proto2_unittest::TestOneof2_NestedEnum,_proto2_unittest::TestOneof2_NestedEnum,_nullptr>
            ((EqHelper *)local_268,"message2.foo_enum()","::proto2_unittest::TestOneof2::FOO",
             &local_26c,&proto2_unittest::TestOneof2::FOO);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_268);
  if (!bVar2) {
    testing::Message::Message(&local_278);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_268);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x809,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__4.message_,&local_278);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_278);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_268);
  pTVar7 = proto2_unittest::TestOneof2::mutable_foo_message
                     ((TestOneof2 *)((long)&message2.field_0 + 0x28));
  proto2_unittest::TestOneof2_NestedMessage::set_moo_int(pTVar7,0xea);
  proto2_unittest::TestOneof2::MergeFrom
            ((TestOneof2 *)local_c0,(TestOneof2 *)((long)&message2.field_0 + 0x28));
  TestUtil::ExpectAtMostOneFieldSetInOneof<proto2_unittest::TestOneof2>((TestOneof2 *)local_c0);
  local_291 = proto2_unittest::TestOneof2::has_foo_message((TestOneof2 *)local_c0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_290,&local_291,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_290);
  if (!bVar2) {
    testing::Message::Message(&local_2a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_4.message_,(internal *)local_290,
               (AssertionResult *)"message2.has_foo_message()","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x80e,pcVar4);
    testing::internal::AssertHelper::operator=(&local_2a8,&local_2a0);
    testing::internal::AssertHelper::~AssertHelper(&local_2a8);
    std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_2a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_290);
  pTVar7 = proto2_unittest::TestOneof2::foo_message((TestOneof2 *)local_c0);
  local_2e0 = proto2_unittest::TestOneof2_NestedMessage::moo_int(pTVar7);
  local_2e4 = 0xea;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_2d8,"message2.foo_message().moo_int()","234",&local_2e0,&local_2e4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d8);
  if (!bVar2) {
    testing::Message::Message(&local_2f0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x80f,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__5.message_,&local_2f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_2f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d8);
  pTVar8 = proto2_unittest::TestOneof2::mutable_foogroup
                     ((TestOneof2 *)((long)&message2.field_0 + 0x28));
  proto2_unittest::TestOneof2_FooGroup::set_a(pTVar8,0x159);
  proto2_unittest::TestOneof2::MergeFrom
            ((TestOneof2 *)local_c0,(TestOneof2 *)((long)&message2.field_0 + 0x28));
  TestUtil::ExpectAtMostOneFieldSetInOneof<proto2_unittest::TestOneof2>((TestOneof2 *)local_c0);
  local_309 = proto2_unittest::TestOneof2::has_foogroup((TestOneof2 *)local_c0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_308,&local_309,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_308);
  if (!bVar2) {
    testing::Message::Message(&local_318);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_5.message_,(internal *)local_308,
               (AssertionResult *)"message2.has_foogroup()","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_320,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x814,pcVar4);
    testing::internal::AssertHelper::operator=(&local_320,&local_318);
    testing::internal::AssertHelper::~AssertHelper(&local_320);
    std::__cxx11::string::~string((string *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_318);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_308);
  pTVar8 = proto2_unittest::TestOneof2::foogroup((TestOneof2 *)local_c0);
  local_354 = proto2_unittest::TestOneof2_FooGroup::a(pTVar8);
  local_358 = 0x159;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_350,"message2.foogroup().a()","345",&local_354,&local_358);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_350);
  if (!bVar2) {
    testing::Message::Message(&local_360);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_350);
    testing::internal::AssertHelper::AssertHelper
              (&local_368,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x815,pcVar4);
    testing::internal::AssertHelper::operator=(&local_368,&local_360);
    testing::internal::AssertHelper::~AssertHelper(&local_368);
    testing::Message::~Message(&local_360);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_350);
  proto2_unittest::TestOneof2::~TestOneof2((TestOneof2 *)local_c0);
  proto2_unittest::TestOneof2::~TestOneof2((TestOneof2 *)((long)&message2.field_0 + 0x28));
  return;
}

Assistant:

TEST_F(OneofTest, MergeFrom) {
  UNITTEST::TestOneof2 message1, message2;

  message1.set_foo_int(123);
  message2.MergeFrom(message1);
  TestUtil::ExpectAtMostOneFieldSetInOneof(message2);
  EXPECT_TRUE(message2.has_foo_int());
  EXPECT_EQ(message2.foo_int(), 123);

  message1.set_foo_string("foo");
  message2.MergeFrom(message1);
  TestUtil::ExpectAtMostOneFieldSetInOneof(message2);
  EXPECT_TRUE(message2.has_foo_string());
  EXPECT_EQ(message2.foo_string(), "foo");


  message1.set_foo_bytes("moo");
  message2.MergeFrom(message1);
  TestUtil::ExpectAtMostOneFieldSetInOneof(message2);
  EXPECT_TRUE(message2.has_foo_bytes());
  EXPECT_EQ(message2.foo_bytes(), "moo");

  message1.set_foo_enum(UNITTEST::TestOneof2::FOO);
  message2.MergeFrom(message1);
  TestUtil::ExpectAtMostOneFieldSetInOneof(message2);
  EXPECT_TRUE(message2.has_foo_enum());
  EXPECT_EQ(message2.foo_enum(), UNITTEST::TestOneof2::FOO);

  message1.mutable_foo_message()->set_moo_int(234);
  message2.MergeFrom(message1);
  TestUtil::ExpectAtMostOneFieldSetInOneof(message2);
  EXPECT_TRUE(message2.has_foo_message());
  EXPECT_EQ(message2.foo_message().moo_int(), 234);

  message1.mutable_foogroup()->set_a(345);
  message2.MergeFrom(message1);
  TestUtil::ExpectAtMostOneFieldSetInOneof(message2);
  EXPECT_TRUE(message2.has_foogroup());
  EXPECT_EQ(message2.foogroup().a(), 345);

}